

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O1

ExpressionSyntax * __thiscall
slang::parsing::Parser::parseValueRangeElement
          (Parser *this,bitmask<slang::parsing::detail::ExpressionOptions> options)

{
  LanguageVersion LVar1;
  bool bVar2;
  ExpressionSyntax *pEVar3;
  Diagnostic *this_00;
  ExpressionSyntax *right;
  ValueRangeExpressionSyntax *pVVar4;
  char *pcVar5;
  size_t sVar6;
  Token openBracket;
  SourceRange range;
  string_view arg;
  Token local_50;
  Token local_40;
  
  bVar2 = ParserBase::peek(&this->super_ParserBase,OpenBracket);
  if (!bVar2) {
    pEVar3 = parseSubExpression(this,options,0);
    return pEVar3;
  }
  openBracket = ParserBase::consume(&this->super_ParserBase);
  pEVar3 = parseSubExpression(this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x0,0);
  Token::Token(&local_50);
  bVar2 = ParserBase::peek(&this->super_ParserBase,PlusDivMinus);
  if (!bVar2) {
    bVar2 = ParserBase::peek(&this->super_ParserBase,PlusModMinus);
    if (!bVar2) {
      local_50 = ParserBase::expect(&this->super_ParserBase,Colon);
      goto LAB_0067d662;
    }
  }
  local_50 = ParserBase::consume(&this->super_ParserBase);
  if ((int)(this->parseOptions).languageVersion < 1) {
    range = Token::range(&local_50);
    this_00 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x20001,range);
    LVar1 = (this->parseOptions).languageVersion;
    sVar6 = 9;
    if (LVar1 == Default) {
      pcVar5 = "1800-2017";
    }
    else if (LVar1 == v1800_2023) {
      pcVar5 = "1800-2023";
    }
    else {
      pcVar5 = "";
      sVar6 = 0;
    }
    arg._M_str = pcVar5;
    arg._M_len = sVar6;
    Diagnostic::operator<<(this_00,arg);
  }
LAB_0067d662:
  right = parseSubExpression(this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x0,0);
  local_40 = ParserBase::expect(&this->super_ParserBase,CloseBracket);
  pVVar4 = slang::syntax::SyntaxFactory::valueRangeExpression
                     (&this->factory,openBracket,pEVar3,local_50,right,local_40);
  return &pVVar4->super_ExpressionSyntax;
}

Assistant:

ExpressionSyntax& Parser::parseValueRangeElement(bitmask<ExpressionOptions> options) {
    if (!peek(TokenKind::OpenBracket))
        return parseSubExpression(options, 0);

    auto openBracket = consume();
    auto& left = parseExpression();

    Token op;
    if (peek(TokenKind::PlusDivMinus) || peek(TokenKind::PlusModMinus)) {
        op = consume();
        if (parseOptions.languageVersion < LanguageVersion::v1800_2023) {
            addDiag(diag::WrongLanguageVersion, op.range())
                << toString(parseOptions.languageVersion);
        }
    }
    else {
        op = expect(TokenKind::Colon);
    }

    auto& right = parseExpression();
    auto closeBracket = expect(TokenKind::CloseBracket);
    return factory.valueRangeExpression(openBracket, left, op, right, closeBracket);
}